

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertInvalidCommand(CommandRunner *this,AssertInvalidCommand *command)

{
  bool bVar1;
  Result RVar2;
  char *format;
  string_view module_filename;
  
  module_filename._M_str = (command->filename)._M_dataplus._M_p;
  module_filename._M_len = (command->filename)._M_string_length;
  RVar2 = ReadInvalidModule(this,(command->super_CommandMixin<(wabt::CommandType)5>).super_Command.
                                 line,module_filename,command->type,"assert_invalid");
  if (RVar2.enum_ == Ok) {
    format = "expected module to be invalid: \"%s\"";
  }
  else {
    bVar1 = CheckIR(&command->filename,true);
    if (!bVar1) {
      return (Result)Ok;
    }
    format = "IR Validator thinks module is valid: \"%s\"";
  }
  PrintError(this,(command->super_CommandMixin<(wabt::CommandType)5>).super_Command.line,format,
             (command->filename)._M_dataplus._M_p);
  return (Result)Error;
}

Assistant:

wabt::Result CommandRunner::OnAssertInvalidCommand(
    const AssertInvalidCommand* command) {
  wabt::Result result = ReadInvalidModule(command->line, command->filename,
                                          command->type, "assert_invalid");
  if (Succeeded(result)) {
    PrintError(command->line, "expected module to be invalid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  if (ValidIR(command->filename)) {
    PrintError(command->line, "IR Validator thinks module is valid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}